

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

bool __thiscall
soplex::SPxLPBase<double>::readFile
          (SPxLPBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          DIdxSet *intVars)

{
  int iVar1;
  undefined1 uVar2;
  allocator local_361;
  string local_360;
  spxifstream file;
  
  std::__cxx11::string::string((string *)&local_360,filename,&local_361);
  zstr::ifstream::ifstream(&file,&local_360,_S_in,0x100000);
  std::__cxx11::string::~string((string *)&local_360);
  if (((&file.super_istream.field_0x20)[(long)file.super_istream._vptr_basic_istream[-3]] & 5) == 0)
  {
    iVar1 = (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1e])
                      (this,&file,rowNames,colNames,intVars);
    uVar2 = (undefined1)iVar1;
  }
  else {
    uVar2 = 0;
  }
  zstr::ifstream::~ifstream(&file);
  return (bool)uVar2;
}

Assistant:

virtual bool readFile(const char* filename, NameSet* rowNames = nullptr,
                         NameSet* colNames = nullptr,
                         DIdxSet* intVars = nullptr)
   {

      spxifstream file(filename);

      if(!file)
         return false;

      return read(file, rowNames, colNames, intVars);
   }